

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O1

void unload_data_entries(DATA_ENTRY *data)

{
  int iVar1;
  char **ppcVar2;
  void *pvVar3;
  
  if ((data != (DATA_ENTRY *)0x0) && (pvVar3 = data->dat, pvVar3 != (void *)0x0)) {
    ppcVar2 = &data->type;
    do {
      iVar1 = strcmp(*ppcVar2,"bitmap");
      if (iVar1 == 0) {
        al_destroy_bitmap(pvVar3);
      }
      iVar1 = strcmp(*ppcVar2,"font");
      if (iVar1 == 0) {
        al_destroy_font(ppcVar2[6]);
      }
      iVar1 = strcmp(*ppcVar2,"sample");
      if (iVar1 == 0) {
        al_destroy_sample(ppcVar2[6]);
      }
      iVar1 = strcmp(*ppcVar2,"music");
      if (iVar1 == 0) {
        al_destroy_audio_stream(ppcVar2[6]);
      }
      pvVar3 = ppcVar2[0xe];
      ppcVar2 = ppcVar2 + 8;
    } while (pvVar3 != (void *)0x0);
  }
  return;
}

Assistant:

void unload_data_entries(DATA_ENTRY *data)
{
    while (data && data->dat) {
        if (!strcmp(data->type, "bitmap")) al_destroy_bitmap(data->dat);
        if (!strcmp(data->type, "font")) al_destroy_font(data->dat);
        if (!strcmp(data->type, "sample")) al_destroy_sample(data->dat);
        if (!strcmp(data->type, "music")) al_destroy_audio_stream(data->dat);
        data++;
    }
}